

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_ManFree(Kf_Man_t *p)

{
  int *piVar1;
  float *pfVar2;
  word *__ptr;
  word **__ptr_00;
  int iVar3;
  Vec_Int_t *__ptr_01;
  long lVar4;
  
  piVar1 = p->pGia->pRefs;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    p->pGia->pRefs = (int *)0x0;
  }
  piVar1 = (p->vCuts).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCuts).pArray = (int *)0x0;
  }
  piVar1 = (p->vTime).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTime).pArray = (int *)0x0;
  }
  pfVar2 = (p->vArea).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vArea).pArray = (float *)0x0;
  }
  pfVar2 = (p->vRefs).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vRefs).pArray = (float *)0x0;
  }
  __ptr_01 = p->vTemp;
  if (__ptr_01 != (Vec_Int_t *)0x0) {
    if (__ptr_01->pArray != (int *)0x0) {
      free(__ptr_01->pArray);
      p->vTemp->pArray = (int *)0x0;
      __ptr_01 = p->vTemp;
      if (__ptr_01 == (Vec_Int_t *)0x0) goto LAB_007636d7;
    }
    free(__ptr_01);
    p->vTemp = (Vec_Int_t *)0x0;
  }
LAB_007636d7:
  iVar3 = (p->pMem).nPagesAlloc;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      __ptr = (p->pMem).pPages[lVar4];
      if (__ptr != (word *)0x0) {
        free(__ptr);
        (p->pMem).pPages[lVar4] = (word *)0x0;
        iVar3 = (p->pMem).nPagesAlloc;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  __ptr_00 = (p->pMem).pPages;
  if (__ptr_00 != (word **)0x0) {
    free(__ptr_00);
  }
  free(p);
  return;
}

Assistant:

void Kf_ManFree( Kf_Man_t * p )
{
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vTime.pArray );
    ABC_FREE( p->vArea.pArray );
    ABC_FREE( p->vRefs.pArray );
    Vec_IntFreeP( &p->vTemp );
    Vec_SetFree_( &p->pMem );
    ABC_FREE( p );
}